

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void js_array_finalizer(JSRuntime *rt,JSValue val)

{
  JSValue v;
  JSRuntime *in_RSI;
  JSValueUnion in_RDI;
  int i;
  JSObject *p;
  undefined4 in_stack_ffffffffffffffd8;
  uint uVar1;
  JSRuntime *pJVar2;
  
  pJVar2 = in_RSI;
  for (uVar1 = 0; uVar1 < *(uint *)&in_RSI->rt_info; uVar1 = uVar1 + 1) {
    v.tag = (int64_t)pJVar2;
    v.u.float64 = in_RDI.float64;
    JS_FreeValueRT(in_RSI,v);
  }
  js_free_rt(in_RSI,(void *)CONCAT44(uVar1,in_stack_ffffffffffffffd8));
  return;
}

Assistant:

static void js_array_finalizer(JSRuntime *rt, JSValue val)
{
    JSObject *p = JS_VALUE_GET_OBJ(val);
    int i;

    for(i = 0; i < p->u.array.count; i++) {
        JS_FreeValueRT(rt, p->u.array.u.values[i]);
    }
    js_free_rt(rt, p->u.array.u.values);
}